

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydata.cpp
# Opt level: O0

pair<QArrayData_*,_void_*>
QArrayData::reallocateUnaligned
          (QArrayData *data,void *dataPointer,qsizetype objectSize,qsizetype capacity,
          AllocationOption option)

{
  pair<QArrayData_*,_void_*> pVar1;
  qsizetype qVar2;
  long lVar3;
  void *in_RSI;
  void *in_RDI;
  long in_FS_OFFSET;
  qptrdiff offset;
  qsizetype allocSize;
  qsizetype headerSize;
  QArrayData *header;
  CalculateGrowingBlockSizeResult r;
  AllocationOption in_stack_ffffffffffffff7c;
  qsizetype in_stack_ffffffffffffff80;
  qsizetype in_stack_ffffffffffffff88;
  qsizetype in_stack_ffffffffffffff90;
  QArrayData *local_38;
  CalculateGrowingBlockSizeResult local_30;
  void *local_20;
  pair<QArrayData_*,_void_*> local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_30.elementCount = 0xaaaaaaaaaaaaaaaa;
  local_30.size = 0xaaaaaaaaaaaaaaaa;
  local_20 = in_RSI;
  local_30 = calculateBlockSize(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                                in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  qVar2 = local_30.elementCount;
  if (local_30.size < 0) {
    std::pair<QArrayData_*,_void_*>::pair<QArrayData_*,_void_*,_true>(&local_18);
  }
  else {
    if (local_20 == (void *)0x0) {
      lVar3 = 0x10;
    }
    else {
      lVar3 = (long)local_20 - (long)in_RDI;
    }
    local_38 = (QArrayData *)realloc(in_RDI,local_30.size);
    if (local_38 == (QArrayData *)0x0) {
      local_20 = (void *)0x0;
    }
    else {
      local_38->alloc = qVar2;
      local_20 = (void *)((long)&(local_38->ref_)._q_value.super___atomic_base<int>._M_i + lVar3);
    }
    std::pair<QArrayData_*,_void_*>::pair<QArrayData_*&,_void_*&,_true>
              (&local_18,&local_38,&local_20);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    pVar1.second = local_18.second;
    pVar1.first = local_18.first;
    return pVar1;
  }
  __stack_chk_fail();
}

Assistant:

std::pair<QArrayData *, void *>
QArrayData::reallocateUnaligned(QArrayData *data, void *dataPointer,
                                qsizetype objectSize, qsizetype capacity, AllocationOption option) noexcept
{
    Q_ASSERT(!data || !data->isShared());

    const qsizetype headerSize = sizeof(AlignedQArrayData);
    auto r = calculateBlockSize(capacity, objectSize, headerSize, option);
    qsizetype allocSize = r.size;
    capacity = r.elementCount;
    if (Q_UNLIKELY(allocSize < 0))
        return {};

    const qptrdiff offset = dataPointer
            ? reinterpret_cast<char *>(dataPointer) - reinterpret_cast<char *>(data)
            : headerSize;
    Q_ASSERT(offset > 0);
    Q_ASSERT(offset <= allocSize); // equals when all free space is at the beginning

    QArrayData *header = static_cast<QArrayData *>(::realloc(data, size_t(allocSize)));
    if (header) {
        header->alloc = capacity;
        dataPointer = reinterpret_cast<char *>(header) + offset;
    } else {
        dataPointer = nullptr;
    }
    return {header, dataPointer};
}